

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O1

id_type __thiscall
Darts::Details::DoubleArrayBuilder::arrange_from_dawg
          (DoubleArrayBuilder *this,DawgBuilder *dawg,id_type dawg_id,id_type dic_id)

{
  DoubleArrayBuilderExtraUnit *pDVar1;
  byte *pbVar2;
  char *pcVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  AutoPool<unsigned_char> *pAVar8;
  uint uVar9;
  uint uVar10;
  AutoPool<unsigned_char> *pAVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  bool bVar15;
  bool bVar16;
  uchar local_49;
  ulong local_48;
  AutoPool<unsigned_char> *local_40;
  ulong local_38;
  ulong uVar7;
  
  pAVar8 = &this->labels_;
  AutoPool<unsigned_char>::resize(pAVar8,0);
  local_38 = (ulong)dawg_id;
  uVar5 = *(uint *)((dawg->units_).buf_.array_ + local_38 * 4);
  if (3 < uVar5) {
    uVar5 = uVar5 >> 2;
    do {
      local_49 = (dawg->labels_).buf_.array_[uVar5];
      AutoPool<unsigned_char>::append(pAVar8,&local_49);
      uVar5 = uVar5 + 1 & -(*(uint *)((dawg->units_).buf_.array_ + (ulong)uVar5 * 4) & 1);
    } while (uVar5 != 0);
  }
  uVar5 = this->extras_head_;
  uVar13 = (this->units_).size_;
  uVar6 = (uint)uVar13;
  if (uVar5 < uVar13) {
    pDVar1 = (this->extras_).array_;
    pbVar2 = (byte *)(this->labels_).buf_.array_;
    uVar13 = (this->labels_).size_;
    pAVar11 = pAVar8;
    uVar9 = uVar5;
    do {
      uVar10 = uVar9 ^ *pbVar2;
      uVar14 = uVar10 & 0xfff;
      if (pDVar1[uVar14].is_used_ == false) {
        bVar15 = (char)(uVar10 ^ dic_id) != '\0';
        bVar16 = ((uVar10 ^ dic_id) & 0x1fe00000) != 0;
        if (bVar16 && bVar15 || uVar13 < 2) {
          bVar15 = (bool)(~(bVar16 && bVar15) & uVar13 < 2);
        }
        else {
          if (pDVar1[pbVar2[1] ^ uVar14].is_fixed_ != false) goto LAB_001f3e2f;
          uVar7 = 1;
          do {
            uVar12 = uVar13;
            if ((2 - uVar13) + uVar7 == 1) break;
            lVar4 = uVar7 + 1;
            uVar12 = uVar7 + 1;
            uVar7 = uVar12;
          } while (pDVar1[pbVar2[lVar4] ^ uVar14].is_fixed_ != true);
          bVar15 = uVar13 <= uVar12;
        }
      }
      else {
LAB_001f3e2f:
        bVar15 = false;
      }
      if (bVar15) {
        pAVar11 = (AutoPool<unsigned_char> *)(ulong)uVar10;
      }
      else {
        uVar9 = pDVar1[uVar9 & 0xfff].next_;
      }
      uVar10 = (uint)pAVar11;
      if (bVar15) goto LAB_001f3ef8;
    } while (uVar9 != uVar5);
    uVar10 = uVar6 | dic_id & 0xff;
  }
  else {
    uVar10 = uVar6 | dic_id & 0xff;
  }
LAB_001f3ef8:
  local_48 = (ulong)dic_id;
  local_40 = pAVar8;
  DoubleArrayBuilderUnit::set_offset
            ((DoubleArrayBuilderUnit *)((this->units_).buf_.array_ + local_48 * 4),dic_id ^ uVar10);
  if ((this->labels_).size_ != 0) {
    uVar5 = *(uint *)((dawg->units_).buf_.array_ + local_38 * 4) >> 2;
    uVar13 = 0;
    pAVar8 = local_40;
    do {
      uVar6 = (byte)(this->labels_).buf_.array_[uVar13] ^ uVar10;
      uVar7 = (ulong)uVar6;
      if ((this->units_).size_ <= uVar7) {
        expand_units(this);
        pAVar8 = local_40;
      }
      if ((this->extras_head_ == uVar6) &&
         (uVar9 = (this->extras_).array_[uVar6 & 0xfff].next_, this->extras_head_ = uVar9,
         uVar9 == uVar6)) {
        this->extras_head_ = (id_type)(this->units_).size_;
      }
      uVar6 = uVar6 & 0xfff;
      pDVar1 = (this->extras_).array_;
      uVar9 = pDVar1[uVar6].prev_;
      pDVar1[(ulong)uVar9 & 0xfff].next_ = pDVar1[uVar6].next_;
      pDVar1[(ulong)pDVar1[uVar6].next_ & 0xfff].prev_ = uVar9;
      pDVar1[uVar6].is_fixed_ = true;
      uVar12 = (ulong)uVar5;
      pcVar3 = (this->units_).buf_.array_;
      if ((dawg->labels_).buf_.array_[uVar12] == '\0') {
        pcVar3[local_48 * 4 + 1] = pcVar3[local_48 * 4 + 1] | 1;
        *(uint *)(pcVar3 + uVar7 * 4) =
             *(uint *)((dawg->units_).buf_.array_ + uVar12 * 4) >> 1 | 0x80000000;
      }
      else {
        pcVar3[uVar7 * 4] = (pAVar8->buf_).array_[uVar13];
      }
      uVar5 = uVar5 + 1 & -(*(uint *)((dawg->units_).buf_.array_ + uVar12 * 4) & 1);
      uVar13 = uVar13 + 1;
    } while (uVar13 < (this->labels_).size_);
  }
  (this->extras_).array_[uVar10 & 0xfff].is_used_ = true;
  return uVar10;
}

Assistant:

inline id_type DoubleArrayBuilder::arrange_from_dawg(const DawgBuilder &dawg,
    id_type dawg_id, id_type dic_id) {
  labels_.resize(0);

  id_type dawg_child_id = dawg.child(dawg_id);
  while (dawg_child_id != 0) {
    labels_.append(dawg.label(dawg_child_id));
    dawg_child_id = dawg.sibling(dawg_child_id);
  }

  id_type offset = find_valid_offset(dic_id);
  units_[dic_id].set_offset(dic_id ^ offset);

  dawg_child_id = dawg.child(dawg_id);
  for (std::size_t i = 0; i < labels_.size(); ++i) {
    id_type dic_child_id = offset ^ labels_[i];
    reserve_id(dic_child_id);

    if (dawg.is_leaf(dawg_child_id)) {
      units_[dic_id].set_has_leaf(true);
      units_[dic_child_id].set_value(dawg.value(dawg_child_id));
    } else {
      units_[dic_child_id].set_label(labels_[i]);
    }

    dawg_child_id = dawg.sibling(dawg_child_id);
  }
  extras(offset).set_is_used(true);

  return offset;
}